

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O0

ifstream_t * ifstream_new(ifstream_handler_t *handler)

{
  ifstream_t *self_00;
  int *piVar1;
  ifstream_t *self;
  ifstream_handler_t *handler_local;
  
  self_00 = (ifstream_t *)malloc(0x20);
  if (self_00 == (ifstream_t *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0xc;
  }
  else {
    ifstream_create(self_00,handler);
  }
  return self_00;
}

Assistant:

ifstream_t *ifstream_new(ifstream_handler_t *handler){
   ifstream_t *self = (ifstream_t*) malloc(sizeof(ifstream_t));
   if(self != 0){
      ifstream_create(self,handler);
   }
   else{
      errno = ENOMEM;
   }
   return self;
}